

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

uint16 crnd::dxt1_block::pack_color(uint32 r,uint32 g,uint32 b,bool scaled,uint32 bias)

{
  undefined1 uVar1;
  uint16 uVar2;
  undefined4 in_EAX;
  undefined1 uVar3;
  undefined1 uVar4;
  uint32 uVar5;
  undefined8 uStack_8;
  
  uVar5 = 0xff;
  if (r < 0xff) {
    uVar5 = r;
  }
  uVar3 = (char)uVar5;
  if ((int)r < 0) {
    uVar3 = 0;
  }
  uVar5 = 0xff;
  if (g < 0xff) {
    uVar5 = g;
  }
  uVar4 = (undefined1)uVar5;
  if ((int)g < 0) {
    uVar4 = 0;
  }
  uVar5 = 0xff;
  if (b < 0xff) {
    uVar5 = b;
  }
  uVar1 = (char)uVar5;
  if ((int)b < 0) {
    uVar1 = 0;
  }
  uStack_8._0_7_ = CONCAT16(uVar1,CONCAT15(uVar4,CONCAT14(uVar3,in_EAX)));
  uStack_8 = (ulong)(uint7)uStack_8;
  uVar2 = pack_color((color_quad_u8 *)((long)&uStack_8 + 4),scaled,bias);
  return uVar2;
}

Assistant:

uint16 dxt1_block::pack_color(uint32 r, uint32 g, uint32 b, bool scaled, uint32 bias)
    {
        return pack_color(color_quad_u8(r, g, b, 0), scaled, bias);
    }